

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_luma_mode_3_to_9
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  WORD32 fract;
  WORD32 pos;
  WORD32 ref_main_idx;
  WORD32 idx;
  WORD32 intra_pred_ang;
  WORD32 two_nt;
  WORD32 col;
  WORD32 row;
  WORD32 mode_local;
  WORD32 nt_local;
  WORD32 dst_strd_local;
  UWORD8 *pu1_dst_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_ref_local;
  
  iVar1 = gai4_ihevc_ang_table[mode];
  for (col = 0; col < nt; col = col + 1) {
    uVar2 = (col + 1) * iVar1;
    uVar3 = uVar2 & 0x1f;
    for (row = 0; row < nt; row = row + 1) {
      iVar4 = (nt * 2 - row) - ((int)uVar2 >> 5);
      pu1_dst[col + row * dst_strd] =
           (UWORD8)((int)((0x20 - uVar3) * (uint)pu1_ref[iVar4 + -1] + uVar3 * pu1_ref[iVar4 + -2] +
                         0x10) >> 5);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode_3_to_9(UWORD8 *pu1_ref,
                                       WORD32 src_strd,
                                       UWORD8 *pu1_dst,
                                       WORD32 dst_strd,
                                       WORD32 nt,
                                       WORD32 mode)
{
    WORD32 row, col;
    WORD32 two_nt = 2 * nt;
    WORD32 intra_pred_ang;
    WORD32 idx, ref_main_idx;
    WORD32 pos, fract;
    UNUSED(src_strd);
    /* Intra Pred Angle according to the mode */
    intra_pred_ang = gai4_ihevc_ang_table[mode];

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    for(col = 0; col < nt; col++)
    {
        pos = ((col + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);

        // Do linear filtering
        for(row = 0; row < nt; row++)
        {
            ref_main_idx = two_nt - row - idx - 1;
            pu1_dst[col + (row * dst_strd)] = (((32 - fract)
                            * pu1_ref[ref_main_idx]
                            + fract * pu1_ref[ref_main_idx - 1] + 16) >> 5);
        }

    }

}